

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O0

FrameSequence *
deqp::egl::anon_unknown_0::generateFrameSequence
          (FrameSequence *__return_storage_ptr__,
          vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
          *frameDrawType,Random *rnd,int numFrames,int width,int height)

{
  undefined4 uVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  undefined1 local_b0 [8];
  DrawCommand drawCommand;
  Vector<int,_2> local_90;
  undefined1 local_88 [8];
  ColoredRect rect;
  int rectHeight;
  int rectNdx;
  undefined1 local_60 [8];
  Frame frame;
  undefined1 local_36 [2];
  int frameNdx;
  undefined1 auStack_30 [2];
  Color color;
  GLubyte b;
  GLubyte g;
  GLubyte r;
  int frameDiff;
  int height_local;
  int width_local;
  int numFrames_local;
  Random *rnd_local;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *frameDrawType_local;
  FrameSequence *frameSequence;
  
  _auStack_30 = height / numFrames;
  unique0x1000026c = height;
  frameNdx._3_1_ = de::Random::getUint8(rnd);
  frameNdx._2_1_ = de::Random::getUint8(rnd);
  frameNdx._1_1_ = de::Random::getUint8(rnd);
  tcu::Vector<unsigned_char,_3>::Vector
            ((Vector<unsigned_char,_3> *)local_36,frameNdx._3_1_,frameNdx._2_1_,frameNdx._1_1_);
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::vector(__return_storage_ptr__);
  for (frame.draws.
       super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      frame.draws.
      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < numFrames;
      frame.draws.
      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           frame.draws.
           super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    Frame::Frame((Frame *)local_60,width,stack0xffffffffffffffd4);
    rect.color.m_data[0] = '\0';
    rect.color.m_data[1] = '\0';
    rect.color.m_data[2] = '\0';
    rect._19_1_ = 0;
    for (; uVar1 = rect._16_4_,
        sVar3 = std::
                vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                ::size(frameDrawType), iVar2 = _auStack_30, (int)uVar1 < (int)sVar3;
        rect._16_4_ = rect._16_4_ + 1) {
      sVar3 = std::
              vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
              ::size(frameDrawType);
      rect.topRight.m_data[1] = iVar2 / (int)sVar3;
      tcu::Vector<int,_2>::Vector
                (&local_90,0,
                 frame.draws.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * _auStack_30 +
                 rect._16_4_ * rect.topRight.m_data[1]);
      tcu::Vector<int,_2>::Vector
                ((Vector<int,_2> *)(drawCommand.rect.topRight.m_data + 1),width,
                 frame.draws.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * _auStack_30 +
                 (rect._16_4_ + 1) * rect.topRight.m_data[1]);
      ColoredRect::ColoredRect
                ((ColoredRect *)local_88,&local_90,(IVec2 *)(drawCommand.rect.topRight.m_data + 1),
                 (Color *)local_36);
      pvVar4 = std::
               vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
               ::operator[](frameDrawType,(long)(int)rect._16_4_);
      DrawCommand::DrawCommand((DrawCommand *)local_b0,*pvVar4,(ColoredRect *)local_88);
      std::
      vector<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
      ::push_back((vector<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                   *)&frame,(value_type *)local_b0);
    }
    std::
    vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_60);
    Frame::~Frame((Frame *)local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

FrameSequence generateFrameSequence (const vector<DrawType>& frameDrawType, de::Random& rnd, int numFrames, int width, int height)
{
	const int			frameDiff		= height / numFrames;
	const GLubyte		r				= rnd.getUint8();
	const GLubyte		g				= rnd.getUint8();
	const GLubyte		b				= rnd.getUint8();
	const Color			color			(r, g, b);
	FrameSequence		frameSequence;

	for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
	{
		Frame frame (width, height);

		for (int rectNdx = 0; rectNdx < (int)frameDrawType.size(); rectNdx++)
		{
			const int			rectHeight		= frameDiff / (int)frameDrawType.size();
			const ColoredRect	rect			(IVec2(0, frameNdx*frameDiff+rectNdx*rectHeight), IVec2(width, frameNdx*frameDiff+(rectNdx+1)*rectHeight), color);
			const DrawCommand	drawCommand		(frameDrawType[rectNdx], rect);

			frame.draws.push_back(drawCommand);
		}
		frameSequence.push_back(frame);
	}
	return frameSequence;
}